

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::Token> * __thiscall
tinyusdz::Attribute::get_value<tinyusdz::Token>
          (optional<tinyusdz::Token> *__return_storage_ptr__,Attribute *this)

{
  optional<tinyusdz::Token> oStack_38;
  
  primvar::PrimVar::get_value<tinyusdz::Token>(&oStack_38,&this->_var);
  nonstd::optional_lite::optional<tinyusdz::Token>::optional<tinyusdz::Token,_0>
            (__return_storage_ptr__,&oStack_38);
  nonstd::optional_lite::optional<tinyusdz::Token>::~optional(&oStack_38);
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return _var.get_value<T>();
  }